

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

int ll_loadfunc(lua_State *L,char *path,char *name,int r)

{
  int iVar1;
  size_t sVar2;
  void **ppvVar3;
  void *pvVar4;
  lua_CFunction f_00;
  char *pcVar5;
  char *local_58;
  char *bcdata;
  lua_CFunction f;
  char *sym;
  void **reg;
  int r_local;
  char *name_local;
  char *path_local;
  lua_State *L_local;
  
  sVar2 = strlen(path);
  if (sVar2 < 0x1000) {
    ppvVar3 = ll_register(L,path);
    if (*ppvVar3 == (void *)0x0) {
      pvVar4 = ll_load(L,path,(uint)(*name == '*'));
      *ppvVar3 = pvVar4;
    }
    if (*ppvVar3 == (void *)0x0) {
      L_local._4_4_ = 1;
    }
    else if (*name == '*') {
      lua_pushboolean(L,1);
      L_local._4_4_ = 0;
    }
    else {
      local_58 = name;
      if (r == 0) {
        local_58 = mksymname(L,name,"luaopen_%s");
      }
      f_00 = ll_sym(L,*ppvVar3,local_58);
      if (f_00 == (lua_CFunction)0x0) {
        if (r == 0) {
          pvVar4 = *ppvVar3;
          pcVar5 = mksymname(L,name,"luaJIT_BC_%s");
          pcVar5 = ll_bcsym(pvVar4,pcVar5);
          lua_settop(L,-2);
          if (pcVar5 != (char *)0x0) {
            iVar1 = luaL_loadbuffer(L,pcVar5,0xffffffffffffffff,name);
            if (iVar1 != 0) {
              return 3;
            }
            return 0;
          }
        }
        L_local._4_4_ = 2;
      }
      else {
        lua_pushcclosure(L,f_00,0);
        L_local._4_4_ = 0;
      }
    }
  }
  else {
    lua_pushlstring(L,"path too long",0xd);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int ll_loadfunc(lua_State *L, const char *path, const char *name, int r)
{
  void **reg;
  if (strlen(path) >= 4096) {
    lua_pushliteral(L, "path too long");
    return PACKAGE_ERR_LIB;
  }
  reg = ll_register(L, path);
  if (*reg == NULL) *reg = ll_load(L, path, (*name == '*'));
  if (*reg == NULL) {
    return PACKAGE_ERR_LIB;  /* Unable to load library. */
  } else if (*name == '*') {  /* Only load library into global namespace. */
    lua_pushboolean(L, 1);
    return 0;
  } else {
    const char *sym = r ? name : mksymname(L, name, SYMPREFIX_CF);
    lua_CFunction f = ll_sym(L, *reg, sym);
    if (f) {
      lua_pushcfunction(L, f);
      return 0;
    }
    if (!r) {
      const char *bcdata = ll_bcsym(*reg, mksymname(L, name, SYMPREFIX_BC));
      lua_pop(L, 1);
      if (bcdata) {
	if (luaL_loadbuffer(L, bcdata, ~(size_t)0, name) != 0)
	  return PACKAGE_ERR_LOAD;
	return 0;
      }
    }
    return PACKAGE_ERR_FUNC;  /* Unable to find function. */
  }
}